

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  float *pfVar1;
  bool bVar2;
  ImGuiKeyModFlags IVar3;
  ImFont *font;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  float fVar7;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  ImVec2 local_78;
  ImGuiWindow *local_70;
  ImGuiWindow *window;
  float local_60;
  int i_1;
  float memory_compact_start_time;
  int local_54;
  ImGuiViewportP *pIStack_50;
  int i;
  ImGuiViewportP *viewport;
  int n_1;
  undefined8 local_3c;
  ImRect local_34;
  int local_24;
  undefined1 local_20 [4];
  int n;
  ImRect virtual_space;
  ImGuiContext *g;
  
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf57,"void ImGui::NewFrame()");
  }
  virtual_space.Max = (ImVec2)GImGui;
  CallContextHooks(GImGui,ImGuiContextHookType_NewFramePre);
  *(undefined4 *)((long)virtual_space.Max + 0x1a20) =
       *(undefined4 *)((long)virtual_space.Max + 0x1a1c);
  ErrorCheckNewFrameSanityChecks();
  *(undefined4 *)((long)virtual_space.Max + 0x1a1c) = *(undefined4 *)((long)virtual_space.Max + 8);
  UpdateSettings();
  *(double *)((long)virtual_space.Max + 0x1b10) =
       (double)*(float *)((long)virtual_space.Max + 0x18) +
       *(double *)((long)virtual_space.Max + 0x1b10);
  *(undefined1 *)((long)virtual_space.Max + 0x1b28) = 1;
  *(int *)((long)virtual_space.Max + 0x1b18) = *(int *)((long)virtual_space.Max + 0x1b18) + 1;
  *(undefined4 *)((long)virtual_space.Max + 0x2f38) = 0;
  *(undefined4 *)((long)virtual_space.Max + 0x1b88) = 0;
  ImVector<unsigned_int>::resize((ImVector<unsigned_int> *)((long)virtual_space.Max + 0x2f50),0);
  *(float *)((long)virtual_space.Max + 0x3220) =
       (*(float *)((long)virtual_space.Max + 0x18) -
       *(float *)((long)virtual_space.Max + 0x303c +
                 (long)*(int *)((long)virtual_space.Max + 0x321c) * 4)) +
       *(float *)((long)virtual_space.Max + 0x3220);
  *(undefined4 *)
   ((long)virtual_space.Max + 0x303c + (long)*(int *)((long)virtual_space.Max + 0x321c) * 4) =
       *(undefined4 *)((long)virtual_space.Max + 0x18);
  *(int *)((long)virtual_space.Max + 0x321c) =
       (*(int *)((long)virtual_space.Max + 0x321c) + 1) % 0x78;
  if (*(float *)((long)virtual_space.Max + 0x3220) <= 0.0) {
    local_80 = 3.4028235e+38;
  }
  else {
    local_80 = 1.0 / (*(float *)((long)virtual_space.Max + 0x3220) / 120.0);
  }
  *(float *)((long)virtual_space.Max + 0x39c) = local_80;
  UpdateViewportsNewFrame();
  **(undefined1 **)((long)virtual_space.Max + 0xa8) = 1;
  font = GetDefaultFont();
  SetCurrentFont(font);
  bVar2 = ImFont::IsLoaded(*(ImFont **)((long)virtual_space.Max + 0x1a28));
  if (!bVar2) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xf77,"void ImGui::NewFrame()");
  }
  ImRect::ImRect((ImRect *)local_20,3.4028235e+38,3.4028235e+38,-3.4028235e+38,-3.4028235e+38);
  for (local_24 = 0; local_24 < *(int *)((long)virtual_space.Max + 0x1d38); local_24 = local_24 + 1)
  {
    ppIVar4 = ImVector<ImGuiViewportP_*>::operator[]
                        ((ImVector<ImGuiViewportP_*> *)((long)virtual_space.Max + 0x1d38),local_24);
    local_34 = ImGuiViewportP::GetMainRect(*ppIVar4);
    ImRect::Add((ImRect *)local_20,&local_34);
  }
  ImVec4::ImVec4((ImVec4 *)((long)&viewport + 4),(float)local_20,(float)n,virtual_space.Min.x,
                 virtual_space.Min.y);
  *(undefined8 *)((long)virtual_space.Max + 0x1a54) = stack0xffffffffffffffbc;
  *(undefined8 *)((long)virtual_space.Max + 0x1a5c) = local_3c;
  *(undefined4 *)((long)virtual_space.Max + 0x1a4c) =
       *(undefined4 *)((long)virtual_space.Max + 0x16f4);
  ImDrawListSharedData::SetCircleSegmentMaxError
            ((ImDrawListSharedData *)((long)virtual_space.Max + 0x1a38),
             *(float *)((long)virtual_space.Max + 0x16f8));
  *(undefined4 *)((long)virtual_space.Max + 0x1a64) = 0;
  if ((*(byte *)((long)virtual_space.Max + 0x16f0) & 1) != 0) {
    *(uint *)((long)virtual_space.Max + 0x1a64) = *(uint *)((long)virtual_space.Max + 0x1a64) | 1;
  }
  if (((*(byte *)((long)virtual_space.Max + 0x16f1) & 1) != 0) &&
     ((*(uint *)(*(long *)(*(long *)((long)virtual_space.Max + 0x1a28) + 0x40) + 4) & 4) == 0)) {
    *(uint *)((long)virtual_space.Max + 0x1a64) = *(uint *)((long)virtual_space.Max + 0x1a64) | 2;
  }
  if ((*(byte *)((long)virtual_space.Max + 0x16f2) & 1) != 0) {
    *(uint *)((long)virtual_space.Max + 0x1a64) = *(uint *)((long)virtual_space.Max + 0x1a64) | 4;
  }
  if ((*(uint *)((long)virtual_space.Max + 0xc) & 8) != 0) {
    *(uint *)((long)virtual_space.Max + 0x1a64) = *(uint *)((long)virtual_space.Max + 0x1a64) | 8;
  }
  for (viewport._0_4_ = 0; (int)viewport < *(int *)((long)virtual_space.Max + 0x1d38);
      viewport._0_4_ = (int)viewport + 1) {
    ppIVar4 = ImVector<ImGuiViewportP_*>::operator[]
                        ((ImVector<ImGuiViewportP_*> *)((long)virtual_space.Max + 0x1d38),
                         (int)viewport);
    pIStack_50 = *ppIVar4;
    (pIStack_50->super_ImGuiViewport).DrawData = (ImDrawData *)0x0;
    ImDrawData::Clear(&pIStack_50->DrawDataP);
  }
  if (((*(byte *)((long)virtual_space.Max + 0x1ef4) & 1) != 0) &&
     (*(int *)((long)virtual_space.Max + 0x1f14) == *(int *)((long)virtual_space.Max + 0x1be8))) {
    KeepAliveID(*(ImGuiID *)((long)virtual_space.Max + 0x1f14));
  }
  if (*(int *)((long)virtual_space.Max + 0x1bd8) == 0) {
    *(undefined4 *)((long)virtual_space.Max + 0x1be0) = 0;
  }
  if ((*(int *)((long)virtual_space.Max + 0x1bd8) == 0) ||
     ((*(int *)((long)virtual_space.Max + 0x1bd4) != 0 &&
      (*(int *)((long)virtual_space.Max + 0x1be8) == *(int *)((long)virtual_space.Max + 0x1bd4)))))
  {
    *(undefined4 *)((long)virtual_space.Max + 0x1be4) = 0;
  }
  if (*(int *)((long)virtual_space.Max + 0x1bd4) != 0) {
    *(float *)((long)virtual_space.Max + 0x1be0) =
         *(float *)((long)virtual_space.Max + 0x18) + *(float *)((long)virtual_space.Max + 0x1be0);
  }
  if ((*(int *)((long)virtual_space.Max + 0x1bd4) != 0) &&
     (*(int *)((long)virtual_space.Max + 0x1be8) != *(int *)((long)virtual_space.Max + 0x1bd4))) {
    *(float *)((long)virtual_space.Max + 0x1be4) =
         *(float *)((long)virtual_space.Max + 0x18) + *(float *)((long)virtual_space.Max + 0x1be4);
  }
  *(undefined4 *)((long)virtual_space.Max + 0x1bd8) =
       *(undefined4 *)((long)virtual_space.Max + 0x1bd4);
  *(undefined4 *)((long)virtual_space.Max + 0x1bd4) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1bdc) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1bdd) = 0;
  if (((*(int *)((long)virtual_space.Max + 0x1bec) != *(int *)((long)virtual_space.Max + 0x1be8)) &&
      (*(int *)((long)virtual_space.Max + 0x1c28) == *(int *)((long)virtual_space.Max + 0x1be8))) &&
     (*(int *)((long)virtual_space.Max + 0x1be8) != 0)) {
    ClearActiveID();
  }
  if (*(int *)((long)virtual_space.Max + 0x1be8) != 0) {
    *(float *)((long)virtual_space.Max + 0x1bf0) =
         *(float *)((long)virtual_space.Max + 0x18) + *(float *)((long)virtual_space.Max + 0x1bf0);
  }
  *(float *)((long)virtual_space.Max + 0x1c3c) =
       *(float *)((long)virtual_space.Max + 0x18) + *(float *)((long)virtual_space.Max + 0x1c3c);
  *(undefined4 *)((long)virtual_space.Max + 0x1c28) =
       *(undefined4 *)((long)virtual_space.Max + 0x1be8);
  *(undefined8 *)((long)virtual_space.Max + 0x1c30) =
       *(undefined8 *)((long)virtual_space.Max + 0x1c18);
  *(byte *)((long)virtual_space.Max + 0x1c2d) = *(byte *)((long)virtual_space.Max + 0x1bf8) & 1;
  *(undefined4 *)((long)virtual_space.Max + 0x1bec) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1bf9) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1c2c) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1bf4) = 0;
  if ((*(int *)((long)virtual_space.Max + 0x2ef8) != 0) &&
     (*(int *)((long)virtual_space.Max + 0x1be8) != *(int *)((long)virtual_space.Max + 0x2ef8))) {
    *(undefined4 *)((long)virtual_space.Max + 0x2ef8) = 0;
  }
  if (*(int *)((long)virtual_space.Max + 0x1be8) == 0) {
    *(undefined4 *)((long)virtual_space.Max + 0x1bfc) = 0;
    *(undefined4 *)((long)virtual_space.Max + 0x1c00) = 0;
    *(undefined8 *)((long)virtual_space.Max + 0x1c08) = 0;
  }
  *(undefined4 *)((long)virtual_space.Max + 0x1f68) =
       *(undefined4 *)((long)virtual_space.Max + 0x1f64);
  *(undefined4 *)((long)virtual_space.Max + 0x1f64) = 0;
  *(undefined4 *)((long)virtual_space.Max + 0x1f60) = 0x7f7fffff;
  *(undefined1 *)((long)virtual_space.Max + 0x1ef5) = 0;
  *(undefined1 *)((long)virtual_space.Max + 0x1ef6) = 0;
  *(undefined4 *)((long)virtual_space.Max + 0x1f70) = 0;
  IVar3 = GetMergedKeyModFlags();
  *(ImGuiKeyModFlags *)((long)virtual_space.Max + 0x3bc) = IVar3;
  memcpy((void *)((long)virtual_space.Max + 0xc98),(void *)((long)virtual_space.Max + 0x498),0x800);
  for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
    if ((*(byte *)((long)virtual_space.Max + 0x140 + (long)local_54) & 1) == 0) {
      local_88 = -1.0;
    }
    else {
      pfVar1 = (float *)((long)virtual_space.Max + 0x498 + (long)local_54 * 4);
      if (0.0 < *pfVar1 || *pfVar1 == 0.0) {
        local_84 = *(float *)((long)virtual_space.Max + 0x498 + (long)local_54 * 4) +
                   *(float *)((long)virtual_space.Max + 0x18);
      }
      else {
        local_84 = 0.0;
      }
      local_88 = local_84;
    }
    *(float *)((long)virtual_space.Max + 0x498 + (long)local_54 * 4) = local_88;
  }
  NavUpdate();
  UpdateMouseInputs();
  DockContextUpdateUndocking((ImGuiContext *)virtual_space.Max);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar5 = GetTopMostPopupModal();
  if ((pIVar5 != (ImGuiWindow *)0x0) ||
     ((*(long *)((long)virtual_space.Max + 0x1ea0) != 0 &&
      (0.0 < *(float *)((long)virtual_space.Max + 0x1ebc))))) {
    fVar7 = ImMin<float>(*(float *)((long)virtual_space.Max + 0x18) * 6.0 +
                         *(float *)((long)virtual_space.Max + 0x1eec),1.0);
    *(float *)((long)virtual_space.Max + 0x1eec) = fVar7;
  }
  else {
    fVar7 = ImMax<float>(-*(float *)((long)virtual_space.Max + 0x18) * 10.0 +
                         *(float *)((long)virtual_space.Max + 0x1eec),0.0);
    *(float *)((long)virtual_space.Max + 0x1eec) = fVar7;
  }
  *(undefined4 *)((long)virtual_space.Max + 0x1ef0) = 0;
  *(undefined4 *)((long)virtual_space.Max + 0x322c) = 0xffffffff;
  *(undefined4 *)((long)virtual_space.Max + 0x3228) = 0xffffffff;
  *(undefined4 *)((long)virtual_space.Max + 0x3224) = 0xffffffff;
  ImVec2::ImVec2((ImVec2 *)&i_1,1.0,1.0);
  *(ImVec2 *)((long)virtual_space.Max + 0x2f60) = _i_1;
  *(undefined8 *)((long)virtual_space.Max + 0x2f70) = 0;
  UpdateMouseWheel();
  UpdateTabFocus();
  if (*(int *)((long)virtual_space.Max + 0x1b48) != *(int *)((long)virtual_space.Max + 0x1b38)) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0xfea,"void ImGui::NewFrame()");
  }
  if (*(float *)((long)virtual_space.Max + 0xd8) < 0.0) {
    local_8c = 3.4028235e+38;
  }
  else {
    local_8c = (float)*(double *)((long)virtual_space.Max + 0x1b10) -
               *(float *)((long)virtual_space.Max + 0xd8);
  }
  local_60 = local_8c;
  for (window._4_4_ = 0; window._4_4_ != *(int *)((long)virtual_space.Max + 0x1b38);
      window._4_4_ = window._4_4_ + 1) {
    ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                        ((ImVector<ImGuiWindow_*> *)((long)virtual_space.Max + 0x1b38),window._4_4_)
    ;
    local_70 = *ppIVar6;
    local_70->WasActive = (bool)(local_70->Active & 1);
    local_70->BeginCount = 0;
    local_70->Active = false;
    local_70->WriteAccessed = false;
    if ((((local_70->WasActive & 1U) == 0) && ((local_70->MemoryCompacted & 1U) == 0)) &&
       (local_70->LastTimeActive < local_60)) {
      GcCompactTransientWindowBuffers(local_70);
    }
  }
  if ((*(long *)((long)virtual_space.Max + 0x1d70) != 0) &&
     ((*(byte *)(*(long *)((long)virtual_space.Max + 0x1d70) + 0xc0) & 1) == 0)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  ImVector<ImGuiWindow_*>::resize((ImVector<ImGuiWindow_*> *)((long)virtual_space.Max + 0x1b68),0);
  ImVector<ImGuiPopupData>::resize((ImVector<ImGuiPopupData> *)((long)virtual_space.Max + 0x1d28),0)
  ;
  ClosePopupsOverWindow(*(ImGuiWindow **)((long)virtual_space.Max + 0x1d70),false);
  DockContextUpdateDocking((ImGuiContext *)virtual_space.Max);
  UpdateDebugToolItemPicker();
  *(undefined1 *)((long)virtual_space.Max + 0x1b29) = 1;
  ImVec2::ImVec2(&local_78,400.0,400.0);
  SetNextWindowSize(&local_78,4);
  Begin("Debug##Default",(bool *)0x0,0);
  if ((*(byte *)(*(long *)((long)virtual_space.Max + 0x1b90) + 199) & 1) != 1) {
    __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                  ,0x100f,"void ImGui::NewFrame()");
  }
  CallContextHooks((ImGuiContext *)virtual_space.Max,ImGuiContextHookType_NewFramePost);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    g.ConfigFlagsLastFrame = g.ConfigFlagsCurrFrame;
    ErrorCheckNewFrameSanityChecks();
    g.ConfigFlagsCurrFrame = g.IO.ConfigFlags;

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    // FIXME-VIEWPORT: the concept of a single ClipRectFullscreen is not ideal!
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(virtual_space.Min.x, virtual_space.Min.y, virtual_space.Max.x, virtual_space.Max.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleSegmentMaxError(g.Style.CircleSegmentMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawData = NULL;
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Undocking
    // (needs to be before UpdateMouseMovingWindowNewFrame so the window is already offset and following the mouse on the detaching frame)
    DockContextUpdateUndocking(&g);

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default
    g.PlatformImePosViewport = NULL;

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.IO.ConfigWindowsMemoryCompactTimer >= 0.0f) ? (float)g.Time - g.IO.ConfigWindowsMemoryCompactTimer : FLT_MAX;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // Docking
    DockContextUpdateDocking(&g);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}